

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O1

bool hasNamesWithSpaces(HighsLogOptions *log_options,HighsInt num_name,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *names)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  if (num_name < 1) {
    bVar1 = false;
  }
  else {
    lVar3 = 0;
    bVar1 = false;
    do {
      lVar2 = std::__cxx11::string::find
                        ((char *)((long)&(((names->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar3),0x3c5f01,0);
      if (!bVar1 && lVar2 != -1) {
        bVar1 = true;
        highsLogDev(log_options,kInfo,"Name |%s| contains a space character in position %d\n",
                    *(undefined8 *)
                     ((long)&(((names->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar3),lVar2);
      }
      lVar3 = lVar3 + 0x20;
    } while ((ulong)(uint)num_name << 5 != lVar3);
  }
  if (bVar1) {
    highsLogDev(log_options,kInfo,"There are %d names with spaces\n",1);
  }
  return bVar1;
}

Assistant:

bool hasNamesWithSpaces(const HighsLogOptions& log_options,
                        const HighsInt num_name,
                        const std::vector<std::string>& names) {
  HighsInt num_names_with_spaces = 0;
  for (HighsInt ix = 0; ix < num_name; ix++) {
    size_t space_pos = names[ix].find(" ");
    if (space_pos != std::string::npos) {
      if (num_names_with_spaces == 0) {
        highsLogDev(
            log_options, HighsLogType::kInfo,
            "Name |%s| contains a space character in position %" HIGHSINT_FORMAT
            "\n",
            names[ix].c_str(), space_pos);
        num_names_with_spaces++;
      }
    }
  }
  if (num_names_with_spaces)
    highsLogDev(log_options, HighsLogType::kInfo,
                "There are %" HIGHSINT_FORMAT " names with spaces\n",
                num_names_with_spaces);
  return num_names_with_spaces > 0;
}